

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.h
# Opt level: O0

StkFloat * __thiscall stk::StkFrames::operator[](StkFrames *this,size_t n)

{
  size_t n_local;
  StkFrames *this_local;
  
  return this->data_ + n;
}

Assistant:

inline StkFloat& StkFrames :: operator[] ( size_t n )
{
#if defined(_STK_DEBUG_)
  if ( n >= size_ ) {
    std::ostringstream error;
    error << "StkFrames::operator[]: invalid index (" << n << ") value!";
    Stk::handleError( error.str(), StkError::MEMORY_ACCESS );
  }
#endif

  return data_[n];
}